

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmundo.cpp
# Opt level: O2

void __thiscall CVmUndo::gc_remove_stale_weak_refs(CVmUndo *this)

{
  int iVar1;
  CVmUndoMeta *pCVar2;
  CVmUndoMeta *undo_rec;
  CVmUndoMeta *pCVar3;
  
  pCVar2 = this->oldest_first_;
  undo_rec = pCVar2;
  if (pCVar2 != (CVmUndoMeta *)0x0) {
    do {
      if (undo_rec == pCVar2) {
        pCVar2 = (undo_rec->link).next_first;
      }
      else if ((undo_rec->rec).obj != 0) {
        iVar1 = CVmObjTable::is_obj_deletable(&G_obj_table_X,(undo_rec->rec).obj);
        if (iVar1 == 0) {
          CVmObjTable::remove_obj_stale_undo_weak_ref
                    (&G_obj_table_X,(undo_rec->rec).obj,&undo_rec->rec);
        }
        else {
          (undo_rec->rec).obj = 0;
        }
      }
      pCVar3 = undo_rec + 1;
      if (undo_rec + 1 == this->rec_arr_ + this->rec_arr_size_) {
        pCVar3 = this->rec_arr_;
      }
      undo_rec = pCVar3;
    } while (pCVar3 != this->next_free_);
  }
  return;
}

Assistant:

void CVmUndo::gc_remove_stale_weak_refs(VMG0_)
{
    CVmUndoMeta *cur;
    CVmUndoMeta *next_link;

    /* if we don't have any records, there's nothing to do */
    if (oldest_first_ == 0)
        return;

    /* the first record is a linking record */
    next_link = oldest_first_;

    /* start at the first record */
    cur = oldest_first_;

    /* 
     *   Go through all undo records, from the oldest to the newest.  Note
     *   that we must keep track of each "link" record, because these are
     *   not ordinary undo records and must be handled differently.  
     */
    for (;;)
    {
        /* check to see if this is a linking record or an ordinary record */
        if (cur == next_link)
        {
            /* 
             *   this is a linking record - simply note the next linking
             *   record and otherwise ignore this record 
             */
            next_link = cur->link.next_first;
        }
        else if (cur->rec.obj != VM_INVALID_OBJ)
        {
            /* 
             *   It's an ordinary undo record -- delete its stale
             *   references.  If the record owner is itself about to be
             *   deleted, don't bother with the object, but rather delete
             *   the entire undo record -- undo records themselves only
             *   weakly reference their owning objects.  
             */
            if (!G_obj_table->is_obj_deletable(cur->rec.obj))
            {
                /* it's not ready for deletion - clean up its weak refs */
                G_obj_table->remove_obj_stale_undo_weak_ref(
                    vmg_ cur->rec.obj, &cur->rec);
            }
            else
            {
                /* 
                 *   it's no longer reachable - delete the undo record by
                 *   setting the owning object to 'invalid' 
                 */
                cur->rec.obj = VM_INVALID_OBJ;
            }
        }

        /* advance to the next record, wrapping at the end of the array */
        ++cur;
        if (cur == rec_arr_ + rec_arr_size_)
            cur = rec_arr_;

        /* stop if we've reached the last record */
        if (cur == next_free_)
            break;
    }
}